

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Windows::TortoiseGitDiffReporter::TortoiseGitDiffReporter
          (TortoiseGitDiffReporter *this)

{
  TortoiseGitTextDiffReporter *this_00;
  TortoiseGitImageDiffReporter *this_01;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_39;
  _Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_38;
  TortoiseGitTextDiffReporter *local_20;
  TortoiseGitImageDiffReporter *local_18;
  
  this_00 = (TortoiseGitTextDiffReporter *)operator_new(0x70);
  TortoiseGitTextDiffReporter::TortoiseGitTextDiffReporter(this_00);
  local_20 = this_00;
  this_01 = (TortoiseGitImageDiffReporter *)operator_new(0x70);
  TortoiseGitImageDiffReporter::TortoiseGitImageDiffReporter(this_01);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_20;
  local_18 = this_01;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            ((vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             &local_38,__l,&local_39);
  FirstWorkingReporter::FirstWorkingReporter
            (&this->super_FirstWorkingReporter,
             (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             &local_38);
  ::std::_Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::
  ~_Vector_base(&local_38);
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_001727e0;
  return;
}

Assistant:

TortoiseGitDiffReporter::TortoiseGitDiffReporter()
            : FirstWorkingReporter(
                  {new TortoiseGitTextDiffReporter(), new TortoiseGitImageDiffReporter()})
        {
        }